

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void init_proc_970(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict3 *__mptr;
  
  init_proc_book3s_common(env);
  gen_spr_sdr1(env);
  gen_spr_book3s_dbg(env);
  gen_spr_970_hid(env);
  gen_spr_970_hior(env);
  gen_low_BATs(env);
  gen_spr_970_pmu_sup(env);
  gen_spr_970_pmu_user(env);
  _spr_register(env,0x3f4,"HID4",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f2,"IABR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  env->dcache_line_size = 0x80;
  env->icache_line_size = 0x80;
  init_excp_970(env);
  ppc970_irq_init((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
  return;
}

Assistant:

static void init_proc_970(CPUPPCState *env)
{
    /* Common Registers */
    init_proc_book3s_common(env);
    gen_spr_sdr1(env);
    gen_spr_book3s_dbg(env);

    /* 970 Specific Registers */
    gen_spr_970_hid(env);
    gen_spr_970_hior(env);
    gen_low_BATs(env);
    gen_spr_970_pmu_sup(env);
    gen_spr_970_pmu_user(env);
    gen_spr_970_lpar(env);
    gen_spr_970_dbg(env);

    /* env variables */
    env->dcache_line_size = 128;
    env->icache_line_size = 128;

    /* Allocate hardware IRQ controller */
    init_excp_970(env);
    ppc970_irq_init(env_archcpu(env));
}